

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

StackSym * __thiscall
GlobOpt::GetOrCreateTaggedIntConstantStackSym(GlobOpt *this,int32 intConstantValue)

{
  StackSym *local_30;
  long local_28;
  
  local_30 = GetTaggedIntConstantStackSym(this,intConstantValue);
  if (local_30 == (StackSym *)0x0) {
    local_30 = StackSym::New(TyVar,this->func);
    local_28 = (long)intConstantValue;
    JsUtil::
    BaseDictionary<long,StackSym*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<long,StackSym*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<long,StackSym*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->intConstantToStackSymMap,&local_28,&local_30);
  }
  return local_30;
}

Assistant:

StackSym *GlobOpt::GetOrCreateTaggedIntConstantStackSym(const int32 intConstantValue) const
{
    StackSym *stackSym = GetTaggedIntConstantStackSym(intConstantValue);
    if(stackSym)
    {
        return stackSym;
    }

    stackSym = StackSym::New(TyVar,func);
    intConstantToStackSymMap->Add(intConstantValue, stackSym);
    return stackSym;
}